

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_do_button(nk_flags *state,nk_command_buffer *out,nk_rect r,nk_style_button *style,
                nk_input *in,nk_button_behavior behavior,nk_rect *content)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  nk_rect r_00;
  
  if (style == (nk_style_button *)0x0) {
    __assert_fail("style",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x4c72,
                  "int nk_do_button(nk_flags *, struct nk_command_buffer *, struct nk_rect, const struct nk_style_button *, const struct nk_input *, enum nk_button_behavior, struct nk_rect *)"
                 );
  }
  if (state != (nk_flags *)0x0) {
    if (out != (nk_command_buffer *)0x0) {
      fVar2 = style->rounding;
      fVar4 = (style->padding).x;
      fVar5 = (style->padding).y;
      fVar3 = style->border;
      content->x = fVar2 + fVar4 + r.x + fVar3;
      content->y = fVar2 + fVar5 + r.y + fVar3;
      content->w = r.w - (fVar2 + fVar2 + fVar4 + fVar4 + fVar3);
      content->h = r.h - (fVar2 + fVar2 + fVar5 + fVar5 + fVar3);
      fVar2 = (style->touch_padding).x;
      r_00.x = r.x - fVar2;
      fVar3 = (style->touch_padding).y;
      r_00.y = r.y - fVar3;
      r_00.h = fVar3 + fVar3 + r.h;
      r_00.w = fVar2 + fVar2 + r.w;
      iVar1 = nk_button_behavior(state,r_00,in,behavior);
      return iVar1;
    }
    __assert_fail("out",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x4c74,
                  "int nk_do_button(nk_flags *, struct nk_command_buffer *, struct nk_rect, const struct nk_style_button *, const struct nk_input *, enum nk_button_behavior, struct nk_rect *)"
                 );
  }
  __assert_fail("state",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x4c73,
                "int nk_do_button(nk_flags *, struct nk_command_buffer *, struct nk_rect, const struct nk_style_button *, const struct nk_input *, enum nk_button_behavior, struct nk_rect *)"
               );
}

Assistant:

NK_LIB int
nk_do_button(nk_flags *state, struct nk_command_buffer *out, struct nk_rect r,
    const struct nk_style_button *style, const struct nk_input *in,
    enum nk_button_behavior behavior, struct nk_rect *content)
{
    struct nk_rect bounds;
    NK_ASSERT(style);
    NK_ASSERT(state);
    NK_ASSERT(out);
    if (!out || !style)
        return nk_false;

    /* calculate button content space */
    content->x = r.x + style->padding.x + style->border + style->rounding;
    content->y = r.y + style->padding.y + style->border + style->rounding;
    content->w = r.w - (2 * style->padding.x + style->border + style->rounding*2);
    content->h = r.h - (2 * style->padding.y + style->border + style->rounding*2);

    /* execute button behavior */
    bounds.x = r.x - style->touch_padding.x;
    bounds.y = r.y - style->touch_padding.y;
    bounds.w = r.w + 2 * style->touch_padding.x;
    bounds.h = r.h + 2 * style->touch_padding.y;
    return nk_button_behavior(state, bounds, in, behavior);
}